

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_dx_iface.c
# Opt level: O2

aom_codec_err_t ctrl_get_tile_count(aom_codec_alg_priv_t *ctx,__va_list_tag *args)

{
  uint uVar1;
  aom_codec_err_t aVar2;
  long *plVar3;
  
  uVar1 = args->gp_offset;
  if ((ulong)uVar1 < 0x29) {
    plVar3 = (long *)((ulong)uVar1 + (long)args->reg_save_area);
    args->gp_offset = uVar1 + 8;
  }
  else {
    plVar3 = (long *)args->overflow_arg_area;
    args->overflow_arg_area = plVar3 + 1;
  }
  if ((int *)*plVar3 == (int *)0x0) {
    aVar2 = AOM_CODEC_INVALID_PARAM;
  }
  else {
    if (ctx->frame_worker != (AVxWorker *)0x0) {
      *(int *)*plVar3 = *(int *)(*ctx->frame_worker->data1 + 0x58de8) + 1;
      return AOM_CODEC_OK;
    }
    aVar2 = AOM_CODEC_ERROR;
  }
  return aVar2;
}

Assistant:

static aom_codec_err_t ctrl_get_tile_count(aom_codec_alg_priv_t *ctx,
                                           va_list args) {
  unsigned int *const tile_count = va_arg(args, unsigned int *);

  if (tile_count) {
    AVxWorker *const worker = ctx->frame_worker;
    if (worker) {
      FrameWorkerData *const frame_worker_data =
          (FrameWorkerData *)worker->data1;
      *tile_count = frame_worker_data->pbi->tile_count_minus_1 + 1;
      return AOM_CODEC_OK;
    } else {
      return AOM_CODEC_ERROR;
    }
  }
  return AOM_CODEC_INVALID_PARAM;
}